

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_test.cc
# Opt level: O2

void __thiscall
(anonymous_namespace)::CFLPredictHBDTest_PredictHBDTest_Test::~CFLPredictHBDTest_PredictHBDTest_Test
          (CFLPredictHBDTest_PredictHBDTest_Test *this)

{
  anon_unknown.dwarf_2d0ac2::CFLPredictHBDTest_PredictHBDTest_Test::
  ~CFLPredictHBDTest_PredictHBDTest_Test((CFLPredictHBDTest_PredictHBDTest_Test *)(this + -0x18));
  return;
}

Assistant:

TEST_P(CFLPredictHBDTest, PredictHBDTest) {
  int bd = 12;
  for (int it = 0; it < NUM_ITERATIONS; it++) {
    randData(bd);
    predict(sub_luma_pels, chroma_pels, CFL_BUF_LINE, alpha_q3, bd);
    predict_ref(sub_luma_pels_ref, chroma_pels_ref, CFL_BUF_LINE, alpha_q3, bd);
    assert_eq<uint16_t>(chroma_pels, chroma_pels_ref, width, height);
  }
}